

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O0

void prune_head(bufq *q)

{
  buf_chunk *chunk_00;
  _Bool local_19;
  buf_chunk *chunk;
  bufq *q_local;
  
  while( true ) {
    local_19 = false;
    if (q->head != (buf_chunk *)0x0) {
      local_19 = chunk_is_empty(q->head);
    }
    if (local_19 == false) break;
    chunk_00 = q->head;
    q->head = chunk_00->next;
    if (q->tail == chunk_00) {
      q->tail = q->head;
    }
    if (q->pool == (bufc_pool *)0x0) {
      if ((q->max_chunks < q->chunk_count) || ((q->opts & 2U) != 0)) {
        (*Curl_cfree)(chunk_00);
        q->chunk_count = q->chunk_count - 1;
      }
      else {
        chunk_00->next = q->spare;
        q->spare = chunk_00;
      }
    }
    else {
      bufcp_put(q->pool,chunk_00);
      q->chunk_count = q->chunk_count - 1;
    }
  }
  return;
}

Assistant:

static void prune_head(struct bufq *q)
{
  struct buf_chunk *chunk;

  while(q->head && chunk_is_empty(q->head)) {
    chunk = q->head;
    q->head = chunk->next;
    if(q->tail == chunk)
      q->tail = q->head;
    if(q->pool) {
      bufcp_put(q->pool, chunk);
      --q->chunk_count;
    }
    else if((q->chunk_count > q->max_chunks) ||
       (q->opts & BUFQ_OPT_NO_SPARES)) {
      /* SOFT_LIMIT allowed us more than max. free spares until
       * we are at max again. Or free them if we are configured
       * to not use spares. */
      free(chunk);
      --q->chunk_count;
    }
    else {
      chunk->next = q->spare;
      q->spare = chunk;
    }
  }
}